

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.hpp
# Opt level: O0

anon_class_136_2_1b09710b *
DataSuppliment<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::__cxx11::string(*)(std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>)>
          (anon_class_136_2_1b09710b *__return_storage_ptr__,
          tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *needed_data,
          _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *f)

{
  undefined1 local_a8 [8];
  anon_class_136_2_1b09710b lambda_f_to_return;
  _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *f_local;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *needed_data_local;
  
  lambda_f_to_return.f = f;
  std::
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::tuple((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)local_a8,needed_data);
  lambda_f_to_return.needed_data.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._24_8_ = lambda_f_to_return.f;
  DataSuppliment<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::__cxx11::string(*)(std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>)>(std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::__cxx11::string(*)(std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>))
  ::{lambda()#1}::DataSuppliment
            ((_lambda___1_ *)__return_storage_ptr__,(anon_class_136_2_1b09710b *)local_a8);
  DataSuppliment<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::__cxx11::string(*)(std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>)>(std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::__cxx11::string(*)(std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>))
  ::{lambda()#1}::~DataSuppliment((_lambda___1_ *)local_a8);
  return __return_storage_ptr__;
}

Assistant:

auto DataSuppliment(suppliment_t needed_data, function_t f) {
  using dsit_t = DataSupplimentInternalType<suppliment_t>;
  const auto lambda_f_to_return = [=]() {
    const dsit_t depinject_func = dsit_t{needed_data};
    return depinject_func(f);
  };
  return lambda_f_to_return;
}